

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_expand.cxx
# Opt level: O1

int fl_filename_expand(char *to,int tolen,char *from)

{
  char *__src;
  char *__dest;
  char cVar1;
  int iVar2;
  char *dst;
  size_t sVar3;
  passwd *ppVar4;
  char *__s;
  long lVar5;
  ulong size;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  char *__dest_00;
  char *pcVar9;
  char *local_58;
  
  size = (ulong)tolen;
  dst = (char *)operator_new__(size);
  fl_strlcpy(dst,from,size);
  sVar3 = strlen(dst);
  local_58 = dst;
  if ((long)sVar3 < 1) {
    iVar2 = 0;
  }
  else {
    pcVar9 = dst + sVar3;
    iVar2 = 0;
    __dest_00 = dst;
    do {
      uVar6 = 0;
      do {
        if (__dest_00[uVar6] == '/') break;
        lVar7 = uVar6 + 1;
        uVar6 = uVar6 + 1;
      } while (__dest_00 + lVar7 < pcVar9);
      __src = __dest_00 + uVar6;
      if (*__dest_00 == '$') {
        cVar1 = __dest_00[uVar6];
        __dest_00[uVar6] = '\0';
        __s = fl_getenv(__dest_00 + 1);
        __dest_00[uVar6] = cVar1;
      }
      else if (*__dest_00 == '~') {
        if (uVar6 < 2) {
          __s = fl_getenv("HOME");
        }
        else {
          cVar1 = __dest_00[uVar6];
          __dest_00[uVar6] = '\0';
          ppVar4 = getpwnam(__dest_00 + 1);
          __dest_00[uVar6] = cVar1;
          if (ppVar4 == (passwd *)0x0) goto LAB_00207f9c;
          __s = ppVar4->pw_dir;
        }
      }
      else {
LAB_00207f9c:
        __s = (char *)0x0;
      }
      if (__s == (char *)0x0) {
        __dest_00 = __src + 1;
      }
      else {
        if (*__s == '/') {
          local_58 = __dest_00;
        }
        sVar3 = strlen(__s);
        sVar3 = (size_t)(int)((int)sVar3 - (uint)(__s[(int)sVar3 + -1] == '/'));
        lVar5 = size - (long)(pcVar9 + (sVar3 - (long)__src) + 1);
        lVar7 = 0;
        if (lVar5 == 0 || (long)size < (long)(pcVar9 + (sVar3 - (long)__src) + 1)) {
          lVar7 = lVar5;
        }
        __dest = __dest_00 + sVar3;
        pcVar8 = pcVar9 + (lVar7 - (long)__src);
        memmove(__dest,__src,(size_t)(pcVar8 + 1));
        pcVar9 = __dest + (long)pcVar8;
        __dest[(long)pcVar8] = '\0';
        memcpy(__dest_00,__s,sVar3);
        iVar2 = iVar2 + 1;
      }
    } while (__dest_00 < pcVar9);
  }
  fl_strlcpy(to,local_58,size);
  operator_delete__(dst);
  return iVar2;
}

Assistant:

int fl_filename_expand(char *to,int tolen, const char *from) {

  char *temp = new char[tolen];
  strlcpy(temp,from, tolen);
  char *start = temp;
  char *end = temp+strlen(temp);

  int ret = 0;

  for (char *a=temp; a<end; ) {	// for each slash component
    char *e; for (e=a; e<end && !isdirsep(*e); e++) {/*empty*/} // find next slash
    const char *value = 0; // this will point at substitute value
    switch (*a) {
    case '~':	// a home directory name
      if (e <= a+1) {	// current user's directory
        value = fl_getenv("HOME");
#ifndef WIN32
      } else {	// another user's directory
	struct passwd *pwd;
	char t = *e; *(char *)e = 0; 
        pwd = getpwnam(a+1); 
        *(char *)e = t;
	    if (pwd) value = pwd->pw_dir;
#endif
      }
      break;
    case '$':		/* an environment variable */
      {char t = *e; *(char *)e = 0; value = fl_getenv(a+1); *(char *)e = t;}
      break;
    }
    if (value) {
      // substitutions that start with slash delete everything before them:
      if (isdirsep(value[0])) start = a;
#if defined(WIN32) || defined(__EMX__) && !defined(__CYGWIN__)
      // also if it starts with "A:"
      if (value[0] && value[1]==':') start = a;
#endif
      int t = (int) strlen(value); if (isdirsep(value[t-1])) t--;
      if ((end+1-e+t) >= tolen) end += tolen - (end+1-e+t);
      memmove(a+t, e, end+1-e);
      end = a+t+(end-e);
      *end = '\0';
      memcpy(a, value, t);
      ret++;
    } else {
      a = e+1;
#if defined(WIN32) || defined(__EMX__) && !defined(__CYGWIN__)
      if (*e == '\\') {*e = '/'; ret++;} // ha ha!
#endif
    }
  }

  strlcpy(to, start, tolen);

  delete[] temp;

  return ret;
}